

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O2

void update_thresh_freq_fact
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,MV_REFERENCE_FRAME ref_frame,
               THR_MODES best_mode_idx,PREDICTION_MODE mode)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  ulong uVar5;
  uint uVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  
  iVar4 = mode_offset(mode);
  bVar1 = mode_idx[(int)CONCAT71(in_register_00000009,ref_frame)][iVar4];
  uVar6 = (uint)CONCAT71(in_register_00000011,bsize);
  uVar2 = 3;
  if (3 < uVar6) {
    uVar2 = uVar6;
  }
  uVar3 = 9;
  if (uVar6 < 9) {
    uVar3 = uVar6;
  }
  uVar5 = (ulong)(uVar2 + 0xfd & 0xff);
  piVar7 = x->thresh_freq_fact[uVar5] + bVar1;
  for (; uVar5 <= uVar3 + 6; uVar5 = uVar5 + 3) {
    iVar4 = *piVar7;
    if (bVar1 == best_mode_idx) {
      iVar8 = iVar4 - (iVar4 >> 4);
    }
    else {
      iVar9 = (cpi->sf).inter_sf.adaptive_rd_thresh * 0x40;
      iVar8 = iVar4 + 1;
      if (iVar9 <= iVar4 + 1) {
        iVar8 = iVar9;
      }
    }
    *piVar7 = iVar8;
    piVar7 = piVar7 + 0x1fb;
  }
  return;
}

Assistant:

static inline void update_thresh_freq_fact(AV1_COMP *cpi, MACROBLOCK *x,
                                           BLOCK_SIZE bsize,
                                           MV_REFERENCE_FRAME ref_frame,
                                           THR_MODES best_mode_idx,
                                           PREDICTION_MODE mode) {
  const THR_MODES thr_mode_idx = mode_idx[ref_frame][mode_offset(mode)];
  const BLOCK_SIZE min_size = AOMMAX(bsize - 3, BLOCK_4X4);
  const BLOCK_SIZE max_size = AOMMIN(bsize + 6, BLOCK_128X128);
  for (BLOCK_SIZE bs = min_size; bs <= max_size; bs += 3) {
    int *freq_fact = &x->thresh_freq_fact[bs][thr_mode_idx];
    if (thr_mode_idx == best_mode_idx) {
      *freq_fact -= (*freq_fact >> 4);
    } else {
      *freq_fact =
          AOMMIN(*freq_fact + RD_THRESH_INC,
                 cpi->sf.inter_sf.adaptive_rd_thresh * RD_THRESH_MAX_FACT);
    }
  }
}